

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSkinnedMesh.cpp
# Opt level: O0

void __thiscall
irr::scene::CSkinnedMesh::skinJoint(CSkinnedMesh *this,SJoint *joint,SJoint *parentJoint)

{
  u32 uVar1;
  int iVar2;
  SSkinMeshBuffer **ppSVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  SJoint *in_RDX;
  CSkinnedMesh *in_RSI;
  long in_RDI;
  vector3d<float> vVar4;
  u32 j;
  SWeight *weight;
  u32 i;
  array<irr::scene::SSkinMeshBuffer_*> *buffersUsed;
  vector3df thisNormalMove;
  vector3df thisVertexMove;
  matrix4 jointVertexPull;
  undefined4 in_stack_fffffffffffffed8;
  eConstructor in_stack_fffffffffffffedc;
  undefined4 in_stack_fffffffffffffee0;
  uint in_stack_fffffffffffffee4;
  float v;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  uint uVar5;
  uint uVar6;
  vector3d<float> local_108;
  vector3d<float> local_f4;
  vector3d<float> local_e8;
  vector3d<float> local_d4;
  vector3d<float> local_c8;
  undefined8 local_b4;
  float local_ac;
  vector3d<float> local_a8;
  undefined8 local_94;
  float local_8c;
  SWeight *local_88;
  uint local_7c;
  undefined8 local_78;
  vector3d<float> local_70;
  vector3d<float> local_64;
  vector3d<float> local_58 [4];
  SJoint *in_stack_ffffffffffffffe0;
  
  uVar1 = core::array<irr::scene::ISkinnedMesh::SWeight>::size
                    ((array<irr::scene::ISkinnedMesh::SWeight> *)0x2a1010);
  if (uVar1 != 0) {
    core::CMatrix4<float>::CMatrix4
              ((CMatrix4<float> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               in_stack_fffffffffffffedc);
    core::CMatrix4<float>::setbyproduct
              ((CMatrix4<float> *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
               (CMatrix4<float> *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
               (CMatrix4<float> *)0x2a1053);
    core::vector3d<float>::vector3d(&local_64);
    core::vector3d<float>::vector3d(&local_70);
    local_78 = *(undefined8 *)(in_RDI + 8);
    local_7c = 0;
    while (in_stack_fffffffffffffee4 = local_7c,
          uVar1 = core::array<irr::scene::ISkinnedMesh::SWeight>::size
                            ((array<irr::scene::ISkinnedMesh::SWeight> *)0x2a10a8),
          in_stack_fffffffffffffee4 < uVar1) {
      local_88 = core::array<irr::scene::ISkinnedMesh::SWeight>::operator[]
                           ((array<irr::scene::ISkinnedMesh::SWeight> *)
                            CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                            in_stack_fffffffffffffedc);
      core::CMatrix4<float>::transformVect
                ((CMatrix4<float> *)local_58,&local_64,&local_88->StaticPos);
      if ((*(byte *)(in_RDI + 0xb8) & 1) != 0) {
        core::CMatrix4<float>::rotateVect
                  ((CMatrix4<float> *)local_58,&local_70,&local_88->StaticNormal);
      }
      v = (float)((ulong)in_RDI >> 0x20);
      if (*local_88->Moved == '\0') {
        *local_88->Moved = '\x01';
        vVar4 = core::vector3d<float>::operator*
                          ((vector3d<float> *)
                           CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),v);
        local_a8._0_8_ = vVar4._0_8_;
        local_94._0_4_ = local_a8.X;
        local_94._4_4_ = local_a8.Y;
        local_a8.Z = vVar4.Z;
        local_8c = local_a8.Z;
        local_a8 = vVar4;
        ppSVar3 = core::array<irr::scene::SSkinMeshBuffer_*>::operator[]
                            ((array<irr::scene::SSkinMeshBuffer_*> *)
                             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                             in_stack_fffffffffffffedc);
        iVar2 = (*((*ppSVar3)->super_IMeshBuffer)._vptr_IMeshBuffer[0x21])
                          (*ppSVar3,(ulong)local_88->vertex_id);
        *(undefined8 *)CONCAT44(extraout_var,iVar2) = local_94;
        *(float *)((undefined8 *)CONCAT44(extraout_var,iVar2) + 1) = local_8c;
        if ((*(byte *)(in_RDI + 0xb8) & 1) != 0) {
          vVar4 = core::vector3d<float>::operator*
                            ((vector3d<float> *)
                             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                             (float)((ulong)in_RDI >> 0x20));
          local_c8._0_8_ = vVar4._0_8_;
          local_b4._0_4_ = local_c8.X;
          local_b4._4_4_ = local_c8.Y;
          local_c8.Z = vVar4.Z;
          local_ac = local_c8.Z;
          local_c8 = vVar4;
          ppSVar3 = core::array<irr::scene::SSkinMeshBuffer_*>::operator[]
                              ((array<irr::scene::SSkinMeshBuffer_*> *)
                               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                               in_stack_fffffffffffffedc);
          iVar2 = (*((*ppSVar3)->super_IMeshBuffer)._vptr_IMeshBuffer[0x21])
                            (*ppSVar3,(ulong)local_88->vertex_id);
          *(undefined8 *)(CONCAT44(extraout_var_00,iVar2) + 0xc) = local_b4;
          *(float *)(CONCAT44(extraout_var_00,iVar2) + 0x14) = local_ac;
        }
      }
      else {
        vVar4 = core::vector3d<float>::operator*
                          ((vector3d<float> *)
                           CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),v);
        local_e8._0_8_ = vVar4._0_8_;
        local_d4.X = local_e8.X;
        local_d4.Y = local_e8.Y;
        local_e8.Z = vVar4.Z;
        local_d4.Z = local_e8.Z;
        local_e8 = vVar4;
        ppSVar3 = core::array<irr::scene::SSkinMeshBuffer_*>::operator[]
                            ((array<irr::scene::SSkinMeshBuffer_*> *)
                             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                             in_stack_fffffffffffffedc);
        iVar2 = (*((*ppSVar3)->super_IMeshBuffer)._vptr_IMeshBuffer[0x21])
                          (*ppSVar3,(ulong)local_88->vertex_id);
        core::vector3d<float>::operator+=
                  ((vector3d<float> *)CONCAT44(extraout_var_01,iVar2),&local_d4);
        if ((*(byte *)(in_RDI + 0xb8) & 1) != 0) {
          vVar4 = core::vector3d<float>::operator*
                            ((vector3d<float> *)
                             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                             (float)((ulong)in_RDI >> 0x20));
          local_108._0_8_ = vVar4._0_8_;
          local_f4.X = local_108.X;
          local_f4.Y = local_108.Y;
          local_108.Z = vVar4.Z;
          local_f4.Z = local_108.Z;
          ppSVar3 = core::array<irr::scene::SSkinMeshBuffer_*>::operator[]
                              ((array<irr::scene::SSkinMeshBuffer_*> *)
                               CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                               in_stack_fffffffffffffedc);
          iVar2 = (*((*ppSVar3)->super_IMeshBuffer)._vptr_IMeshBuffer[0x21])
                            (*ppSVar3,(ulong)local_88->vertex_id);
          core::vector3d<float>::operator+=
                    ((vector3d<float> *)(CONCAT44(extraout_var_02,iVar2) + 0xc),&local_f4);
        }
      }
      ppSVar3 = core::array<irr::scene::SSkinMeshBuffer_*>::operator[]
                          ((array<irr::scene::SSkinMeshBuffer_*> *)
                           CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                           in_stack_fffffffffffffedc);
      SSkinMeshBuffer::boundingBoxNeedsRecalculated(*ppSVar3);
      local_7c = local_7c + 1;
    }
  }
  uVar5 = 0;
  while (uVar6 = uVar5,
        uVar1 = core::array<irr::scene::ISkinnedMesh::SJoint_*>::size
                          ((array<irr::scene::ISkinnedMesh::SJoint_*> *)0x2a13bd), uVar5 < uVar1) {
    core::array<irr::scene::ISkinnedMesh::SJoint_*>::operator[]
              ((array<irr::scene::ISkinnedMesh::SJoint_*> *)
               CONCAT44(in_stack_fffffffffffffee4,uVar5),in_stack_fffffffffffffedc);
    skinJoint(in_RSI,in_RDX,in_stack_ffffffffffffffe0);
    uVar5 = uVar6 + 1;
  }
  return;
}

Assistant:

void CSkinnedMesh::skinJoint(SJoint *joint, SJoint *parentJoint)
{
	if (joint->Weights.size()) {
		// Find this joints pull on vertices...
		core::matrix4 jointVertexPull(core::matrix4::EM4CONST_NOTHING);
		jointVertexPull.setbyproduct(joint->GlobalAnimatedMatrix, joint->GlobalInversedMatrix);

		core::vector3df thisVertexMove, thisNormalMove;

		core::array<scene::SSkinMeshBuffer *> &buffersUsed = *SkinningBuffers;

		// Skin Vertices Positions and Normals...
		for (u32 i = 0; i < joint->Weights.size(); ++i) {
			SWeight &weight = joint->Weights[i];

			// Pull this vertex...
			jointVertexPull.transformVect(thisVertexMove, weight.StaticPos);

			if (AnimateNormals)
				jointVertexPull.rotateVect(thisNormalMove, weight.StaticNormal);

			if (!(*(weight.Moved))) {
				*(weight.Moved) = true;

				buffersUsed[weight.buffer_id]->getVertex(weight.vertex_id)->Pos = thisVertexMove * weight.strength;

				if (AnimateNormals)
					buffersUsed[weight.buffer_id]->getVertex(weight.vertex_id)->Normal = thisNormalMove * weight.strength;

				//*(weight._Pos) = thisVertexMove * weight.strength;
			} else {
				buffersUsed[weight.buffer_id]->getVertex(weight.vertex_id)->Pos += thisVertexMove * weight.strength;

				if (AnimateNormals)
					buffersUsed[weight.buffer_id]->getVertex(weight.vertex_id)->Normal += thisNormalMove * weight.strength;

				//*(weight._Pos) += thisVertexMove * weight.strength;
			}

			buffersUsed[weight.buffer_id]->boundingBoxNeedsRecalculated();
		}
	}

	// Skin all children
	for (u32 j = 0; j < joint->Children.size(); ++j)
		skinJoint(joint->Children[j], joint);
}